

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

LIBSSH2_SESSION *
libssh2_session_init_ex
          (_func_void_ptr_size_t_void_ptr_ptr *my_alloc,_func_void_void_ptr_void_ptr_ptr *my_free,
          _func_void_ptr_void_ptr_size_t_void_ptr_ptr *my_realloc,void *abstract)

{
  LIBSSH2_SESSION *pLVar1;
  code *pcVar2;
  uint uVar3;
  uint uVar4;
  void *abstract_local;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  _func_void_ptr_void_ptr_size_t_void_ptr_ptr *local_38;
  _func_void_void_ptr_void_ptr_ptr *p_Stack_30;
  
  pcVar2 = libssh2_default_alloc;
  if (my_alloc != (_func_void_ptr_size_t_void_ptr_ptr *)0x0) {
    pcVar2 = my_alloc;
  }
  abstract_local = abstract;
  pLVar1 = (LIBSSH2_SESSION *)(*pcVar2)(0x11f80,&abstract_local);
  if (pLVar1 != (LIBSSH2_SESSION *)0x0) {
    uStack_44 = -(uint)((int)my_realloc == 0);
    uVar3 = -(uint)((int)((ulong)my_realloc >> 0x20) == 0);
    uStack_3c = -(uint)((int)my_free == 0);
    uVar4 = -(uint)((int)((ulong)my_free >> 0x20) == 0);
    local_48 = uVar3 & uStack_44;
    uStack_44 = uStack_44 & uVar3;
    uStack_40 = uVar4 & uStack_3c;
    uStack_3c = uStack_3c & uVar4;
    local_38 = my_realloc;
    p_Stack_30 = my_free;
    memset(&pLVar1->ssh_msg_ignore,0,0x11f58);
    pLVar1->alloc = pcVar2;
    pLVar1->realloc =
         (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)
         (~CONCAT44(uStack_44,local_48) & (ulong)local_38 | (ulong)local_48 & 0x120ff7);
    pLVar1->free = (_func_void_void_ptr_void_ptr_ptr *)
                   (~CONCAT44(uStack_3c,uStack_40) & (ulong)p_Stack_30 | (ulong)uStack_40 & 0x120ff2
                   );
    pLVar1->send = _libssh2_send;
    pLVar1->recv = _libssh2_recv;
    pLVar1->abstract = abstract_local;
    pLVar1->api_block_mode = 1;
    pLVar1->state = 1;
    pLVar1->packet_read_timeout = 0x3c;
    (pLVar1->flag).quote_paths = 1;
    _libssh2_init_if_needed();
  }
  return pLVar1;
}

Assistant:

LIBSSH2_API LIBSSH2_SESSION *
libssh2_session_init_ex(LIBSSH2_ALLOC_FUNC((*my_alloc)),
                        LIBSSH2_FREE_FUNC((*my_free)),
                        LIBSSH2_REALLOC_FUNC((*my_realloc)), void *abstract)
{
    LIBSSH2_ALLOC_FUNC((*local_alloc)) = libssh2_default_alloc;
    LIBSSH2_FREE_FUNC((*local_free)) = libssh2_default_free;
    LIBSSH2_REALLOC_FUNC((*local_realloc)) = libssh2_default_realloc;
    LIBSSH2_SESSION *session;

    if(my_alloc) {
        local_alloc = my_alloc;
    }
    if(my_free) {
        local_free = my_free;
    }
    if(my_realloc) {
        local_realloc = my_realloc;
    }

    session = local_alloc(sizeof(LIBSSH2_SESSION), &abstract);
    if(session) {
        memset(session, 0, sizeof(LIBSSH2_SESSION));
        session->alloc = local_alloc;
        session->free = local_free;
        session->realloc = local_realloc;
        session->send = _libssh2_send;
        session->recv = _libssh2_recv;
        session->abstract = abstract;
        session->api_timeout = 0; /* timeout-free API by default */
        session->api_block_mode = 1; /* blocking API by default */
        session->state = LIBSSH2_STATE_INITIAL_KEX;
        session->fullpacket_required_type = 0;
        session->packet_read_timeout = LIBSSH2_DEFAULT_READ_TIMEOUT;
        session->flag.quote_paths = 1; /* default behavior is to quote paths
                                          for the scp subsystem */
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "New session resource allocated"));
        _libssh2_init_if_needed();
    }
    return session;
}